

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

ssize_t archive_write_mtree_data(archive_write *a,void *buff,size_t n)

{
  mtree_writer *mtree_00;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  mtree_writer *mtree;
  size_t local_20;
  
  mtree_00 = *(mtree_writer **)(in_RDI + 0xd0);
  local_20 = in_RDX;
  if (mtree_00->entry_bytes_remaining < in_RDX) {
    local_20 = mtree_00->entry_bytes_remaining;
  }
  mtree_00->entry_bytes_remaining = mtree_00->entry_bytes_remaining - local_20;
  if ((mtree_00->mtree_entry != (mtree_entry_conflict *)0x0) &&
     (mtree_00->mtree_entry->filetype == 0x8000)) {
    sum_update(mtree_00,in_RSI,local_20);
  }
  return local_20;
}

Assistant:

static ssize_t
archive_write_mtree_data(struct archive_write *a, const void *buff, size_t n)
{
	struct mtree_writer *mtree= a->format_data;

	if (n > mtree->entry_bytes_remaining)
		n = (size_t)mtree->entry_bytes_remaining;
	mtree->entry_bytes_remaining -= n;

	/* We don't need to compute a regular file sum */
	if (mtree->mtree_entry == NULL)
		return (n);

	if (mtree->mtree_entry->filetype == AE_IFREG)
		sum_update(mtree, buff, n);

	return (n);
}